

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
ptc::Print<char>::operator()
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Print<char> *this,mode *first,char (*args) [5],char (*args_1) [19])

{
  int iVar1;
  undefined1 *local_48;
  long local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  if (*first == str) {
    if (operator()<char_const(&)[5],char_const(&)[19]>(ptc::mode&&,char_const&[],char_const&[])::
        oss_abi_cxx11_ == '\0') {
      iVar1 = __cxa_guard_acquire(&operator()<char_const(&)[5],char_const(&)[19]>(ptc::mode&&,char_const&[],char_const&[])
                                   ::oss_abi_cxx11_);
      if (iVar1 != 0) {
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)
                   &operator()<char_const(&)[5],char_const(&)[19]>(ptc::mode&&,char_const&[],char_const&[])
                    ::oss_abi_cxx11_);
        __cxa_atexit(std::__cxx11::ostringstream::~ostringstream,
                     &operator()<char_const(&)[5],char_const(&)[19]>(ptc::mode&&,char_const&[],char_const&[])
                      ::oss_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&operator()<char_const(&)[5],char_const(&)[19]>(ptc::mode&&,char_const&[],char_const&[])
                             ::oss_abi_cxx11_);
      }
    }
    local_40 = 0;
    local_38 = 0;
    local_48 = &local_38;
    std::__cxx11::stringbuf::str((string *)&DAT_00115798);
    if (local_48 != &local_38) {
      operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
    }
    std::ios::clear((int)*(undefined8 *)
                          (operator()<char_const(&)[5],char_const(&)[19]>(ptc::mode&&,char_const&[],char_const&[])
                           ::oss_abi_cxx11_ + -0x18) + 0x115790);
    print_backend<std::__cxx11::ostringstream&,char_const(&)[5],char_const(&)[19]>
              (this,(basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &operator()<char_const(&)[5],char_const(&)[19]>(ptc::mode&&,char_const&[],char_const&[])
                     ::oss_abi_cxx11_,args,args_1);
    std::__cxx11::stringbuf::str();
  }
  else {
    local_48 = &local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_48,local_48 + local_40);
    if (local_48 != &local_38) {
      operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const std::basic_string<T_str> operator()( mode&& first, Args&&... args ) const
     { 
      if constexpr( sizeof...( args ) > 0 )
       {
        switch( first )
         {
          case mode::str:
           {
            static std::basic_ostringstream<T_str> oss;
            oss.str( StringConverter<T_str>( ""s ) );
            oss.clear();
            print_backend( oss, std::forward<Args>( args )... );

            return oss.str();
           }
         }
       }
       
      return StringConverter<T_str>( "" );
     }